

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O3

bool ConsiderPatches(char *arg)

{
  uint uVar1;
  char *patchfile;
  ulong uVar2;
  FString *args;
  FString *local_30;
  
  uVar1 = DArgs::CheckParmList(Args,arg,&local_30,1);
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      patchfile = BaseFileSearch(local_30[uVar2].Chars,".deh",false);
      if (patchfile == (char *)0x0) {
        patchfile = BaseFileSearch(local_30[uVar2].Chars,".bex",false);
        if (patchfile != (char *)0x0) goto LAB_004ba6ff;
      }
      else {
LAB_004ba6ff:
        D_LoadDehFile(patchfile);
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return 0 < (int)uVar1;
}

Assistant:

bool ConsiderPatches (const char *arg)
{
	int i, argc;
	FString *args;
	const char *f;

	argc = Args->CheckParmList(arg, &args);
	for (i = 0; i < argc; ++i)
	{
		if ( (f = BaseFileSearch(args[i], ".deh")) ||
			 (f = BaseFileSearch(args[i], ".bex")) )
		{
			D_LoadDehFile(f);
		}
	}
	return argc > 0;
}